

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btTriangle>::~btAlignedObjectArray(btAlignedObjectArray<btTriangle> *this)

{
  if ((*(void **)(this + 0x10) != (void *)0x0) &&
     (this[0x18] == (btAlignedObjectArray<btTriangle>)0x1)) {
    btAlignedFreeInternal(*(void **)(this + 0x10));
  }
  this[0x18] = (btAlignedObjectArray<btTriangle>)0x1;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 4) = 0;
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}